

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Archive
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,MemIOWriter *Writer)

{
  bool bVar1;
  int iVar2;
  reference pPVar3;
  byte local_41;
  _Self local_30;
  _Self local_28;
  const_iterator l_i;
  bool result;
  MemIOWriter *Writer_local;
  SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this_local;
  
  l_i._M_node._7_1_ = 1;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::begin
                 (&this->
                   super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                 );
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::end
                   (&this->
                     super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   );
    bVar1 = std::operator!=(&local_28,&local_30);
    local_41 = 0;
    if (bVar1) {
      local_41 = l_i._M_node._7_1_;
    }
    if ((local_41 & 1) == 0) break;
    pPVar3 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator*(&local_28);
    iVar2 = (*(pPVar3->super_IArchive)._vptr_IArchive[4])();
    l_i._M_node._7_1_ = (byte)iVar2 & 1;
    std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_28,0);
  }
  return (bool)(l_i._M_node._7_1_ & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    bool result = true;
	    typename std::list<T>::const_iterator l_i = this->begin();

	    for ( ; l_i != this->end() && result; l_i++ )
	      result = (*l_i).Archive(Writer);

	    return result;
	  }